

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O3

Str tl::toUtf8(CStr32 o)

{
  uint uVar1;
  uint uVar2;
  uint3 uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long in_RDX;
  ulong extraout_RDX;
  ulong uVar7;
  ulong extraout_RDX_00;
  byte bVar8;
  u32 size;
  StrT<char> *this;
  long lVar9;
  Str SVar10;
  
  this = o._0_8_;
  if ((int)o._str == 0) {
    StrT<char>::StrT(this,0,'.');
    uVar7 = extraout_RDX_00;
  }
  else {
    lVar9 = ((ulong)o._str & 0xffffffff) << 2;
    lVar4 = 0;
    size = 0;
    do {
      uVar6 = *(uint *)(in_RDX + lVar4);
      iVar5 = 1;
      if ((0x7f < uVar6) && (iVar5 = 2, 0x7ff < uVar6)) {
        iVar5 = 4 - (uint)(uVar6 < 0x10000);
      }
      size = size + iVar5;
      lVar4 = lVar4 + 4;
    } while (lVar9 != lVar4);
    StrT<char>::StrT(this,size,'.');
    uVar7 = extraout_RDX;
    if ((int)o._str != 0) {
      lVar4 = 0;
      uVar6 = 0;
      do {
        uVar1 = *(uint *)(in_RDX + lVar4);
        uVar7 = (ulong)uVar1;
        if (uVar1 < 0x80) {
          if (this->_size <= uVar6) goto LAB_00343a7f;
          iVar5 = 1;
        }
        else {
          uVar2 = this->_size;
          bVar8 = (byte)uVar1;
          uVar3 = (uint3)(uVar1 >> 8);
          if (uVar1 < 0x800) {
            if ((uVar2 <= uVar6 + 1) ||
               (this->_str[uVar6 + 1] = bVar8 & 0x3f | 0x80, this->_size <= uVar6))
            goto LAB_00343a7f;
            uVar7 = (ulong)CONCAT31(uVar3 >> 6,(char)(uVar1 >> 6)) | 0xc0;
            iVar5 = 2;
          }
          else if (uVar1 < 0x10000) {
            if (uVar2 <= uVar6 + 2) {
LAB_00343a7f:
              __assert_fail("i < _size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/str.hpp"
                            ,0x52,"CharT &tl::StrT<char>::operator[](u32) [CharT = char]");
            }
            this->_str[uVar6 + 2] = bVar8 & 0x3f | 0x80;
            if ((this->_size <= uVar6 + 1) ||
               (this->_str[uVar6 + 1] = (byte)(uVar1 >> 6) & 0x3f | 0x80, this->_size <= uVar6))
            goto LAB_00343a7f;
            uVar7 = (ulong)CONCAT31(uVar3 >> 0xc,(char)(uVar1 >> 0xc)) | 0xe0;
            iVar5 = 3;
          }
          else {
            if (uVar2 <= uVar6 + 3) goto LAB_00343a7f;
            this->_str[uVar6 + 3] = bVar8 & 0x3f | 0x80;
            if (this->_size <= uVar6 + 2) goto LAB_00343a7f;
            this->_str[uVar6 + 2] = (byte)(uVar1 >> 6) & 0x3f | 0x80;
            if ((this->_size <= uVar6 + 1) ||
               (this->_str[uVar6 + 1] = (byte)(uVar1 >> 0xc) & 0x3f | 0x80, this->_size <= uVar6))
            goto LAB_00343a7f;
            uVar7 = (ulong)(uVar1 >> 0x12) & 0xffffffffffffff07 | 0xf0;
            iVar5 = 4;
          }
        }
        this->_str[uVar6] = (char)uVar7;
        uVar6 = uVar6 + iVar5;
        lVar4 = lVar4 + 4;
      } while (lVar9 != lVar4);
    }
  }
  SVar10._8_8_ = uVar7;
  SVar10._str = (char *)this;
  return SVar10;
}

Assistant:

Str toUtf8(CStr32 o)
{
    const u32 size = calcSizeUtf8(o);
    Str str(size);
    u32 j = 0;
    for(char32_t c : o) {
        if(c < 0x80) {
            str[j] = c & 0b0111'1111;
            j += 1;
        }
        else if(c < 0x800) {
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1100'0000 | (0b1'1111 & c);
            j += 2;
        }
        else if(c < 0x10000) {
            str[j+2] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1110'0000 | (0b1111 & c);
            j += 3;
        }
        else {
            str[j+3] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+2] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j+1] = 0b1000'0000 | (0b11'1111 & c);
            c >>= 6;
            str[j] = 0b1111'0000 | (0b111 & c);
            j += 4;
        }
    }
    return str;
}